

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HubContext.cpp
# Opt level: O3

error_code __thiscall
SL::WS_LITE::TLSContext::add_verify_path(TLSContext *this,string *path,error_code *ec)

{
  element_type *peVar1;
  pointer psVar2;
  element_type *peVar3;
  int iVar4;
  error_category *peVar5;
  ulong uVar6;
  error_category *peVar7;
  pointer psVar8;
  error_code eVar9;
  
  peVar5 = (error_category *)std::_V2::system_category();
  peVar1 = (this->HubContext_).
           super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar8 = (peVar1->ThreadContexts).
           super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (peVar1->ThreadContexts).
           super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 == psVar2) {
    uVar6 = 0;
    peVar7 = peVar5;
  }
  else {
    do {
      peVar3 = (psVar8->super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      ERR_clear_error();
      uVar6 = 0;
      iVar4 = SSL_CTX_load_verify_locations
                        ((SSL_CTX *)(peVar3->context).handle_,(char *)0x0,(path->_M_dataplus)._M_p);
      peVar7 = peVar5;
      if (iVar4 != 1) {
        uVar6 = ERR_get_error();
        if ((asio::error::get_ssl_category()::instance == '\0') &&
           (iVar4 = __cxa_guard_acquire(&asio::error::get_ssl_category()::instance), iVar4 != 0)) {
          __cxa_atexit(std::_V2::error_category::~error_category,
                       &asio::error::get_ssl_category()::instance,&__dso_handle);
          __cxa_guard_release(&asio::error::get_ssl_category()::instance);
        }
        peVar7 = (error_category *)&asio::error::get_ssl_category()::instance;
      }
      ec->_M_value = (int)uVar6;
      ec->_M_cat = peVar7;
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar2);
  }
  eVar9._0_8_ = uVar6 & 0xffffffff;
  eVar9._M_cat = peVar7;
  return eVar9;
}

Assistant:

virtual std::error_code add_verify_path(const std::string &path, std::error_code &ec) override
        {
            std::error_code e;
            for (auto &a : HubContext_->ThreadContexts) {
                e = a->context.add_verify_path(path, ec);
            }
            return e;
        }